

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_copy_stuff_from_conf(Terminal *term)

{
  _Bool _Var1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  char *pcStack_28;
  char c;
  char *n;
  char *pcStack_18;
  wchar_t maxlen;
  char *answerback;
  Terminal *term_local;
  
  answerback = (char *)term;
  _Var1 = conf_get_bool(term->conf,0x8f);
  answerback[0x1181] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x8d);
  answerback[0x1194] = _Var1;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x70);
  *(int *)(answerback + 0x1198) = iVar3;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x72);
  answerback[0x119c] = _Var1;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x73);
  *(int *)(answerback + 0x11a0) = iVar3;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x75);
  *(int *)(answerback + 0x11a4) = iVar3;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x74);
  *(int *)(answerback + 0x11a8) = iVar3;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x8e);
  answerback[0x11ac] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x48);
  answerback[0x11ad] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x6f);
  answerback[0x11ae] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x7b);
  answerback[0x11af] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0xa7);
  answerback[0x11b0] = _Var1;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x7e);
  *(int *)(answerback + 0x11b4) = iVar3;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x7d);
  *(int *)(answerback + 0x11b8) = iVar3;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0xcc);
  answerback[0x11bc] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),100);
  answerback[0x11bd] = _Var1;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x4a);
  *(int *)(answerback + 0x11c0) = iVar3;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x4b);
  *(int *)(answerback + 0x11c4) = iVar3;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x6d);
  answerback[0x11c8] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x84);
  answerback[0x11c9] = _Var1;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x82);
  *(int *)(answerback + 0x11cc) = iVar3;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x9c);
  answerback[0x11d0] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x58);
  answerback[0x11d1] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x50);
  answerback[0x11d2] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x4c);
  answerback[0x11d3] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x4d);
  answerback[0x11d4] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x53);
  answerback[0x11d5] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x4e);
  answerback[0x11d6] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x54);
  answerback[0x11d7] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x4f);
  answerback[0x11d8] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x51);
  answerback[0x11d9] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x52);
  answerback[0x11da] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x99);
  answerback[0x11db] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x9a);
  answerback[0x11dc] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x97);
  answerback[0x11dd] = _Var1;
  iVar3 = conf_get_int(*(Conf **)(answerback + 0x1110),0x55);
  *(int *)(answerback + 0x11e0) = iVar3;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x49);
  answerback[0x11e4] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),99);
  answerback[0x11e5] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x62);
  answerback[0x11e6] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x4e);
  answerback[0x1c0] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x90);
  answerback[0x11e7] = _Var1;
  _Var1 = conf_get_bool(*(Conf **)(answerback + 0x1110),0x91);
  answerback[0x11e8] = _Var1;
  pcStack_18 = conf_get_str(*(Conf **)(answerback + 0x1110),0x8b);
  sVar4 = strlen(pcStack_18);
  n._4_4_ = (int)sVar4;
  pvVar5 = safemalloc((long)n._4_4_,1,0);
  *(void **)(answerback + 0x1188) = pvVar5;
  answerback[0x1190] = '\0';
  answerback[0x1191] = '\0';
  answerback[0x1192] = '\0';
  answerback[0x1193] = '\0';
  while (*pcStack_18 != '\0') {
    cVar2 = ctrlparse(pcStack_18,&stack0xffffffffffffffd8);
    if (pcStack_28 == (char *)0x0) {
      cVar2 = *pcStack_18;
      iVar3 = *(int *)(answerback + 0x1190);
      *(int *)(answerback + 0x1190) = iVar3 + 1;
      *(char *)(*(long *)(answerback + 0x1188) + (long)iVar3) = cVar2;
      pcStack_18 = pcStack_18 + 1;
    }
    else {
      iVar3 = *(int *)(answerback + 0x1190);
      *(int *)(answerback + 0x1190) = iVar3 + 1;
      *(char *)(*(long *)(answerback + 0x1188) + (long)iVar3) = cVar2;
      pcStack_18 = pcStack_28;
    }
  }
  return;
}

Assistant:

void term_copy_stuff_from_conf(Terminal *term)
{
    term->ansi_colour = conf_get_bool(term->conf, CONF_ansi_colour);
    term->no_arabicshaping = conf_get_bool(term->conf, CONF_no_arabicshaping);
    term->beep = conf_get_int(term->conf, CONF_beep);
    term->bellovl = conf_get_bool(term->conf, CONF_bellovl);
    term->bellovl_n = conf_get_int(term->conf, CONF_bellovl_n);
    term->bellovl_s = conf_get_int(term->conf, CONF_bellovl_s);
    term->bellovl_t = conf_get_int(term->conf, CONF_bellovl_t);
    term->no_bidi = conf_get_bool(term->conf, CONF_no_bidi);
    term->bksp_is_delete = conf_get_bool(term->conf, CONF_bksp_is_delete);
    term->blink_cur = conf_get_bool(term->conf, CONF_blink_cur);
    term->blinktext = conf_get_bool(term->conf, CONF_blinktext);
    term->cjk_ambig_wide = conf_get_bool(term->conf, CONF_cjk_ambig_wide);
    term->conf_height = conf_get_int(term->conf, CONF_height);
    term->conf_width = conf_get_int(term->conf, CONF_width);
    term->crhaslf = conf_get_bool(term->conf, CONF_crhaslf);
    term->erase_to_scrollback = conf_get_bool(term->conf, CONF_erase_to_scrollback);
    term->funky_type = conf_get_int(term->conf, CONF_funky_type);
    term->sharrow_type = conf_get_int(term->conf, CONF_sharrow_type);
    term->lfhascr = conf_get_bool(term->conf, CONF_lfhascr);
    term->logflush = conf_get_bool(term->conf, CONF_logflush);
    term->logtype = conf_get_int(term->conf, CONF_logtype);
    term->mouse_override = conf_get_bool(term->conf, CONF_mouse_override);
    term->nethack_keypad = conf_get_bool(term->conf, CONF_nethack_keypad);
    term->no_alt_screen = conf_get_bool(term->conf, CONF_no_alt_screen);
    term->no_applic_c = conf_get_bool(term->conf, CONF_no_applic_c);
    term->no_applic_k = conf_get_bool(term->conf, CONF_no_applic_k);
    term->no_dbackspace = conf_get_bool(term->conf, CONF_no_dbackspace);
    term->no_mouse_rep = conf_get_bool(term->conf, CONF_no_mouse_rep);
    term->no_remote_charset = conf_get_bool(term->conf, CONF_no_remote_charset);
    term->no_remote_resize = conf_get_bool(term->conf, CONF_no_remote_resize);
    term->no_remote_wintitle = conf_get_bool(term->conf, CONF_no_remote_wintitle);
    term->no_remote_clearscroll = conf_get_bool(term->conf, CONF_no_remote_clearscroll);
    term->rawcnp = conf_get_bool(term->conf, CONF_rawcnp);
    term->utf8linedraw = conf_get_bool(term->conf, CONF_utf8linedraw);
    term->rect_select = conf_get_bool(term->conf, CONF_rect_select);
    term->remote_qtitle_action = conf_get_int(term->conf, CONF_remote_qtitle_action);
    term->rxvt_homeend = conf_get_bool(term->conf, CONF_rxvt_homeend);
    term->scroll_on_disp = conf_get_bool(term->conf, CONF_scroll_on_disp);
    term->scroll_on_key = conf_get_bool(term->conf, CONF_scroll_on_key);
    term->xterm_mouse_forbidden = conf_get_bool(term->conf, CONF_no_mouse_rep);
    term->xterm_256_colour = conf_get_bool(term->conf, CONF_xterm_256_colour);
    term->true_colour = conf_get_bool(term->conf, CONF_true_colour);

    /*
     * Parse the control-character escapes in the configured
     * answerback string.
     */
    {
        char *answerback = conf_get_str(term->conf, CONF_answerback);
        int maxlen = strlen(answerback);

        term->answerback = snewn(maxlen, char);
        term->answerbacklen = 0;

        while (*answerback) {
            char *n;
            char c = ctrlparse(answerback, &n);
            if (n) {
                term->answerback[term->answerbacklen++] = c;
                answerback = n;
            } else {
                term->answerback[term->answerbacklen++] = *answerback++;
            }
        }
    }
}